

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O0

void si9ma::BinaryTree::print_tree(TreeNode *head)

{
  undefined8 head_00;
  ostream *this;
  allocator local_31;
  undefined1 local_30 [40];
  TreeNode *head_local;
  
  local_30._32_8_ = head;
  this = std::operator<<((ostream *)&std::cout,"Binary Tree");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  head_00 = local_30._32_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"H",&local_31);
  print_in_order((TreeNode *)head_00,0,0x11,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BinaryTree::print_tree(const TreeNode *head) {
        cout << "Binary Tree" << endl;
        print_in_order(head,0,17,"H");
        cout << endl;
    }